

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O3

void __thiscall
duckdb::ColumnReader::
PlainTemplatedDefines<signed_char,duckdb::TemplatedParquetValueConversion<int>,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  data_t dVar1;
  data_ptr_t pdVar2;
  uint64_t uVar3;
  
  if (plain_data->len < num_values * 4) {
    PlainTemplatedInternal<signed_char,duckdb::TemplatedParquetValueConversion<int>,false,true>
              (this,plain_data,defines,num_values,result_offset,result);
    return;
  }
  pdVar2 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (result_offset < result_offset + num_values) {
    uVar3 = 0;
    do {
      dVar1 = *plain_data->ptr;
      plain_data->len = plain_data->len - 4;
      plain_data->ptr = plain_data->ptr + 4;
      pdVar2[uVar3 + result_offset] = dVar1;
      uVar3 = uVar3 + 1;
    } while (num_values != uVar3);
  }
  return;
}

Assistant:

void PlainTemplatedDefines(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values, idx_t result_offset,
	                           Vector &result) {
		if (CONVERSION::PlainAvailable(plain_data, num_values)) {
			PlainTemplatedInternal<VALUE_TYPE, CONVERSION, HAS_DEFINES, false>(plain_data, defines, num_values,
			                                                                   result_offset, result);
		} else {
			PlainTemplatedInternal<VALUE_TYPE, CONVERSION, HAS_DEFINES, true>(plain_data, defines, num_values,
			                                                                  result_offset, result);
		}
	}